

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManDfsSlacksPrint(Gia_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *__ptr;
  Vec_Int_t *__s;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  __ptr = Gia_ManDfsSlacks(p);
  uVar8 = __ptr->nSize;
  uVar6 = (ulong)uVar8;
  if (uVar6 == 0) {
    puts("Network contains no internal objects.");
    __s = __ptr;
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
  }
  else {
    if (0 < (int)uVar8) {
      piVar2 = __ptr->pArray;
      uVar5 = 0;
      do {
        iVar4 = piVar2[uVar5];
        if (iVar4 != -1) {
          piVar2[uVar5] = iVar4 / 10;
        }
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    uVar7 = *__ptr->pArray;
    if (1 < (int)uVar8) {
      uVar5 = 1;
      do {
        uVar1 = __ptr->pArray[uVar5];
        if ((int)uVar7 <= (int)uVar1) {
          uVar7 = uVar1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    uVar1 = uVar7 + 1;
    uVar3 = 0x10;
    if (0xe < uVar7) {
      uVar3 = uVar1;
    }
    if (uVar3 == 0) {
      __s = (Vec_Int_t *)0x0;
    }
    else {
      __s = (Vec_Int_t *)malloc((long)(int)uVar3 << 2);
    }
    if (__s != (Vec_Int_t *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
    }
    if (0 < (int)uVar8) {
      piVar2 = __ptr->pArray;
      uVar5 = 0;
      do {
        uVar8 = piVar2[uVar5];
        if ((ulong)uVar8 != 0xffffffff) {
          if (((int)uVar8 < 0) || ((int)uVar7 < (int)uVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          (&__s->nCap)[uVar8] = (&__s->nCap)[uVar8] + 1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    if ((int)uVar7 < 0) {
      iVar4 = 0;
    }
    else {
      uVar6 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + (&__s->nCap)[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    if (iVar4 < 1) {
      __assert_fail("nTotal > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                    ,0x498,"void Gia_ManDfsSlacksPrint(Gia_Man_t *)");
    }
    if (-1 < (int)uVar7) {
      uVar6 = 0;
      uVar8 = 0;
      do {
        uVar7 = (&__s->nCap)[uVar6];
        printf("Slack range %3d = ",uVar6 & 0xffffffff);
        uVar6 = uVar6 + 1;
        printf("[%4d, %4d)   ",(ulong)uVar8,(ulong)(uVar8 + 10));
        printf("Nodes = %5d  ",(ulong)uVar7);
        printf("(%6.2f %%) ",((double)(int)uVar7 * 100.0) / (double)iVar4);
        putchar(10);
        uVar8 = uVar8 + 10;
      } while (uVar1 != uVar6);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
  }
  if (__s == (Vec_Int_t *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Gia_ManDfsSlacksPrint( Gia_Man_t * p )
{
    Vec_Int_t * vCounts, * vSlacks = Gia_ManDfsSlacks( p );
    int i, Entry, nRange, nTotal;
    if ( Vec_IntSize(vSlacks) == 0 )
    {
        printf( "Network contains no internal objects.\n" );
        Vec_IntFree( vSlacks );
        return;
    }
    // compute slacks
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntWriteEntry( vSlacks, i, Entry/10 );
    nRange = Vec_IntFindMax( vSlacks );
    // count items
    vCounts = Vec_IntStart( nRange + 1 );
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    // print slack ranges
    nTotal = Vec_IntSum( vCounts );
    assert( nTotal > 0 );
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        printf( "Slack range %3d = ", i );
        printf( "[%4d, %4d)   ", 10*i, 10*(i+1) );
        printf( "Nodes = %5d  ", Entry );
        printf( "(%6.2f %%) ", 100.0*Entry/nTotal );
        printf( "\n" );
    }
    Vec_IntFree( vSlacks );
    Vec_IntFree( vCounts );
}